

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int main(void)

{
  bool bVar1;
  stop local_3e;
  stop local_3d;
  pause local_3c;
  end_pause local_3b;
  pause local_3a;
  play local_39;
  cd_detected local_38;
  cd_detected local_34;
  open_close local_2e;
  open_close local_2d [13];
  undefined1 local_20 [8];
  Player p;
  
  p.super_StateMachine._12_4_ = 0;
  anon_unknown.dwarf_5f76::Player::Player((Player *)local_20);
  bVar1 = state_machine::state_machine::StateMachine<$9a4d5606$>::
          is_state<(anonymous_namespace)::Empty,_0>((StateMachine<_9a4d5606_> *)local_20);
  if (!bVar1) {
    __assert_fail("p.is_state<Empty>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/examples/simple2/main.cc"
                  ,0x79,"int main()");
  }
  std::operator<<((ostream *)&std::cout,'\n');
  state_machine::state_machine::StateMachine<$9a4d5606$>::
  process_event<(anonymous_namespace)::open_close,_0>((StateMachine<_9a4d5606_> *)local_20,local_2d)
  ;
  bVar1 = state_machine::state_machine::StateMachine<$9a4d5606$>::
          is_state<(anonymous_namespace)::Open,_0>((StateMachine<_9a4d5606_> *)local_20);
  if (!bVar1) {
    __assert_fail("p.is_state<Open>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/examples/simple2/main.cc"
                  ,0x7e,"int main()");
  }
  std::operator<<((ostream *)&std::cout,'\n');
  state_machine::state_machine::StateMachine<$9a4d5606$>::
  process_event<(anonymous_namespace)::open_close,_0>
            ((StateMachine<_9a4d5606_> *)local_20,&local_2e);
  bVar1 = state_machine::state_machine::StateMachine<$9a4d5606$>::
          is_state<(anonymous_namespace)::Empty,_0>((StateMachine<_9a4d5606_> *)local_20);
  if (!bVar1) {
    __assert_fail("p.is_state<Empty>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/examples/simple2/main.cc"
                  ,0x83,"int main()");
  }
  std::operator<<((ostream *)&std::cout,'\n');
  anon_unknown.dwarf_5f76::cd_detected::cd_detected(&local_34,DVD);
  state_machine::state_machine::StateMachine<$9a4d5606$>::
  process_event<(anonymous_namespace)::cd_detected,_0>
            ((StateMachine<_9a4d5606_> *)local_20,&local_34);
  bVar1 = state_machine::state_machine::StateMachine<$9a4d5606$>::
          is_state<(anonymous_namespace)::Empty,_0>((StateMachine<_9a4d5606_> *)local_20);
  if (!bVar1) {
    __assert_fail("p.is_state<Empty>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/examples/simple2/main.cc"
                  ,0x89,"int main()");
  }
  std::operator<<((ostream *)&std::cout,'\n');
  anon_unknown.dwarf_5f76::cd_detected::cd_detected(&local_38,CD);
  state_machine::state_machine::StateMachine<$9a4d5606$>::
  process_event<(anonymous_namespace)::cd_detected,_0>
            ((StateMachine<_9a4d5606_> *)local_20,&local_38);
  bVar1 = state_machine::state_machine::StateMachine<$9a4d5606$>::
          is_state<(anonymous_namespace)::Stopped,_0>((StateMachine<_9a4d5606_> *)local_20);
  if (!bVar1) {
    __assert_fail("p.is_state<Stopped>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/examples/simple2/main.cc"
                  ,0x8e,"int main()");
  }
  std::operator<<((ostream *)&std::cout,'\n');
  state_machine::state_machine::StateMachine<$9a4d5606$>::
  process_event<(anonymous_namespace)::play,_0>((StateMachine<_9a4d5606_> *)local_20,&local_39);
  bVar1 = state_machine::state_machine::StateMachine<$9a4d5606$>::
          is_state<(anonymous_namespace)::Playing,_0>((StateMachine<_9a4d5606_> *)local_20);
  if (!bVar1) {
    __assert_fail("p.is_state<Playing>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/examples/simple2/main.cc"
                  ,0x93,"int main()");
  }
  std::operator<<((ostream *)&std::cout,'\n');
  state_machine::state_machine::StateMachine<$9a4d5606$>::
  process_event<(anonymous_namespace)::pause,_0>((StateMachine<_9a4d5606_> *)local_20,&local_3a);
  bVar1 = state_machine::state_machine::StateMachine<$9a4d5606$>::
          is_state<(anonymous_namespace)::Paused,_0>((StateMachine<_9a4d5606_> *)local_20);
  if (!bVar1) {
    __assert_fail("p.is_state<Paused>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/examples/simple2/main.cc"
                  ,0x98,"int main()");
  }
  std::operator<<((ostream *)&std::cout,'\n');
  state_machine::state_machine::StateMachine<$9a4d5606$>::
  process_event<(anonymous_namespace)::end_pause,_0>((StateMachine<_9a4d5606_> *)local_20,&local_3b)
  ;
  bVar1 = state_machine::state_machine::StateMachine<$9a4d5606$>::
          is_state<(anonymous_namespace)::Playing,_0>((StateMachine<_9a4d5606_> *)local_20);
  if (!bVar1) {
    __assert_fail("p.is_state<Playing>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/examples/simple2/main.cc"
                  ,0x9d,"int main()");
  }
  std::operator<<((ostream *)&std::cout,'\n');
  state_machine::state_machine::StateMachine<$9a4d5606$>::
  process_event<(anonymous_namespace)::pause,_0>((StateMachine<_9a4d5606_> *)local_20,&local_3c);
  bVar1 = state_machine::state_machine::StateMachine<$9a4d5606$>::
          is_state<(anonymous_namespace)::Paused,_0>((StateMachine<_9a4d5606_> *)local_20);
  if (!bVar1) {
    __assert_fail("p.is_state<Paused>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/examples/simple2/main.cc"
                  ,0xa2,"int main()");
  }
  std::operator<<((ostream *)&std::cout,'\n');
  state_machine::state_machine::StateMachine<$9a4d5606$>::
  process_event<(anonymous_namespace)::stop,_0>((StateMachine<_9a4d5606_> *)local_20,&local_3d);
  bVar1 = state_machine::state_machine::StateMachine<$9a4d5606$>::
          is_state<(anonymous_namespace)::Stopped,_0>((StateMachine<_9a4d5606_> *)local_20);
  if (!bVar1) {
    __assert_fail("p.is_state<Stopped>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/examples/simple2/main.cc"
                  ,0xa7,"int main()");
  }
  std::operator<<((ostream *)&std::cout,'\n');
  state_machine::state_machine::StateMachine<$9a4d5606$>::
  process_event<(anonymous_namespace)::stop,_0>((StateMachine<_9a4d5606_> *)local_20,&local_3e);
  bVar1 = state_machine::state_machine::StateMachine<$9a4d5606$>::
          is_state<(anonymous_namespace)::Stopped,_0>((StateMachine<_9a4d5606_> *)local_20);
  if (!bVar1) {
    __assert_fail("p.is_state<Stopped>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/examples/simple2/main.cc"
                  ,0xae,"int main()");
  }
  std::operator<<((ostream *)&std::cout,'\n');
  p.super_StateMachine._12_4_ = 0;
  anon_unknown.dwarf_5f76::Player::~Player((Player *)local_20);
  return p.super_StateMachine._12_4_;
}

Assistant:

auto main() -> int {
    // The state machine starts as soon as it is created.
    auto p = Player{};
    assert(p.is_state<Empty>());

    std::cout << '\n';

    p.process_event(open_close());
    assert(p.is_state<Open>());

    std::cout << '\n';

    p.process_event(open_close());
    assert(p.is_state<Empty>());

    std::cout << '\n';

    // will be rejected, wrong disk type
    p.process_event(cd_detected(DiskType::DVD));
    assert(p.is_state<Empty>());

    std::cout << '\n';

    p.process_event(cd_detected(DiskType::CD));
    assert(p.is_state<Stopped>());

    std::cout << '\n';

    p.process_event(play());
    assert(p.is_state<Playing>());

    std::cout << '\n';

    p.process_event(pause());
    assert(p.is_state<Paused>());

    std::cout << '\n';

    p.process_event(end_pause());
    assert(p.is_state<Playing>());

    std::cout << '\n';

    p.process_event(pause());
    assert(p.is_state<Paused>());

    std::cout << '\n';

    p.process_event(stop());
    assert(p.is_state<Stopped>());

    std::cout << '\n';

    // event leading to the same state
    // no action method called as it is not present in the transition table
    p.process_event(stop());
    assert(p.is_state<Stopped>());

    std::cout << '\n';

    return 0;
}